

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O2

bool __thiscall
GOESRProduct::matchProduct
          (GOESRProduct *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *products)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pbVar3;
  __type_conflict _Var4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  char *pcVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *product;
  pointer pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (products->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (products->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = true;
  if (pbVar1 != pbVar2) {
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (pbVar1,pbVar2,&this->product_);
    if (_Var5._M_current == pbVar2) {
      pbVar3 = (products->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar7 = false;
      for (pbVar8 = (products->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3;
          pbVar8 = pbVar8 + 1) {
        if ((pbVar8->_M_string_length != 0) &&
           (pcVar6 = (char *)std::__cxx11::string::at((ulong)pbVar8), *pcVar6 == '^')) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar8);
          _Var4 = std::operator==(&local_50,&(this->product_).nameShort);
          std::__cxx11::string::~string((string *)&local_50);
          bVar7 = true;
          if (_Var4) {
            return false;
          }
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool GOESRProduct::matchProduct(const std::vector<std::string>& products) const {
  if (products.empty()) {
    return true;
  }

  // Check for a positive match.
  const auto begin = std::begin(products);
  const auto end = std::end(products);
  const auto it = std::find(begin, end, product_.nameShort);
  if (it != end) {
    return true;
  }

  // Check for a negative match.
  bool performed_negative_check = false;
  for (const auto& product : products) {
    if (product.empty() || product.at(0) != '^') {
      continue;
    }
    // Compare the sub-string after the negation character.
    performed_negative_check = true;
    if (product.substr(1) == product_.nameShort) {
      return false;
    }
  }

  return performed_negative_check;
}